

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O2

void __thiscall
wasm::HashStringifyWalker::visitExpression(HashStringifyWalker *this,Expression *curr)

{
  pair<std::__detail::_Node_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_true>,_bool>
  pVar1;
  Expression *local_38;
  uint32_t local_30;
  Expression *local_28;
  Expression *curr_local;
  
  local_30 = this->nextVal;
  local_38 = curr;
  local_28 = curr;
  pVar1 = std::
          _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,unsigned_int>,std::allocator<std::pair<wasm::Expression*const,unsigned_int>>,std::__detail::_Select1st,wasm::StringifyEquator,wasm::StringifyHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::Expression*const,unsigned_int>>
                    ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,unsigned_int>,std::allocator<std::pair<wasm::Expression*const,unsigned_int>>,std::__detail::_Select1st,wasm::StringifyEquator,wasm::StringifyHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->exprToCounter,&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->hashString,
             (value_type_conflict2 *)
             ((long)pVar1.first.
                    super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_true>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_true>
             + 0x10));
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&this->exprs,&local_28);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    this->nextVal = this->nextVal + 1;
  }
  return;
}

Assistant:

void HashStringifyWalker::visitExpression(Expression* curr) {
  auto [it, inserted] = exprToCounter.insert({curr, nextVal});
  hashString.push_back(it->second);
  exprs.push_back(curr);
  if (inserted) {
    nextVal++;
  }
}